

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

Node * __thiscall rw::ColorQuant::getNode(ColorQuant *this,Node *root,uint32 addr,int32 level)

{
  uint uVar1;
  Node *pNVar2;
  uint32 a;
  int32 level_local;
  uint32 addr_local;
  Node *root_local;
  ColorQuant *this_local;
  
  this_local = (ColorQuant *)root;
  if (level != 0) {
    uVar1 = addr & 0xf;
    if (root->children[uVar1] == (Node *)0x0) {
      pNVar2 = createNode(this,level + -1);
      root->children[uVar1] = pNVar2;
      root->children[uVar1]->parent = root;
    }
    this_local = (ColorQuant *)getNode(this,root->children[uVar1],addr >> 4,level + -1);
  }
  return (Node *)this_local;
}

Assistant:

ColorQuant::Node*
ColorQuant::getNode(ColorQuant::Node *root, uint32 addr, int32 level)
{
	if(level == 0)
		return root;

	uint32 a = addr & 0xF;
	if(root->children[a] == nil){
		root->children[a] = this->createNode(level-1);
		root->children[a]->parent = root;
	}

	return this->getNode(root->children[a], addr>>4, level-1);
}